

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_tree.cc
# Opt level: O0

float memory_tree_ns::get_overlap_from_two_examples(example *ec1,example *ec2)

{
  uint32_t uVar1;
  v_array<unsigned_int> *in_stack_00000028;
  v_array<unsigned_int> *in_stack_00000030;
  
  uVar1 = over_lap(in_stack_00000030,in_stack_00000028);
  return (float)uVar1;
}

Assistant:

float get_overlap_from_two_examples(example& ec1, example& ec2){
        return (float)over_lap(ec1.l.multilabels.label_v, ec2.l.multilabels.label_v);
    }